

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::internal::DecodeMacCounters
                  (Error *__return_storage_ptr__,MacCounters *aMacCounters,ByteArray *aBuf)

{
  pointer puVar1;
  char *pcVar2;
  size_t i;
  long lVar3;
  uint uVar4;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_a0;
  ErrorCode local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar1 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 0x24) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfInUnknownProtos = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 4] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfInErrors = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 8] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfOutErrors = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0xc] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfInUcastPkts = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0x10] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfInBroadcastPkts = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0x14] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfInDiscards = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0x18] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfOutUcastPkts = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0x1c] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfOutBroadcastPkts = uVar4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uint)puVar1[lVar3 + 0x20] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    aMacCounters->mIfOutDiscards = uVar4;
  }
  else {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "incorrect size of MacCounters";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1d;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    begin = "incorrect size of MacCounters";
    local_58.context_.types_ = local_58.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_58);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"incorrect size of MacCounters",(string_view)ZEXT816(0x1d),args);
    local_80 = kBadFormat;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    __return_storage_ptr__->mCode = local_80;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeMacCounters(MacCounters &aMacCounters, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    VerifyOrExit(length == kMacCountersBytes, error = ERROR_BAD_FORMAT("incorrect size of MacCounters"));
    aMacCounters.mIfInUnknownProtos  = utils::Decode<uint32_t>(aBuf.data(), 4);
    aMacCounters.mIfInErrors         = utils::Decode<uint32_t>(aBuf.data() + 4, 4);
    aMacCounters.mIfOutErrors        = utils::Decode<uint32_t>(aBuf.data() + 8, 4);
    aMacCounters.mIfInUcastPkts      = utils::Decode<uint32_t>(aBuf.data() + 12, 4);
    aMacCounters.mIfInBroadcastPkts  = utils::Decode<uint32_t>(aBuf.data() + 16, 4);
    aMacCounters.mIfInDiscards       = utils::Decode<uint32_t>(aBuf.data() + 20, 4);
    aMacCounters.mIfOutUcastPkts     = utils::Decode<uint32_t>(aBuf.data() + 24, 4);
    aMacCounters.mIfOutBroadcastPkts = utils::Decode<uint32_t>(aBuf.data() + 28, 4);
    aMacCounters.mIfOutDiscards      = utils::Decode<uint32_t>(aBuf.data() + 32, 4);

exit:
    return error;
}